

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
 __thiscall spvtools::opt::analysis::BoolConstant::Copy(BoolConstant *this)

{
  _func_int **in_RAX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  CopyBoolConstant((BoolConstant *)&stack0xffffffffffffffe8);
  (this->super_ScalarConstant).super_Constant._vptr_Constant = local_18;
  return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Constant> Copy() const override {
    return std::unique_ptr<Constant>(CopyBoolConstant().release());
  }